

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O1

StreamIn * prvTidyFileInput(TidyDocImpl *doc,FILE *fp,int encoding)

{
  int iVar1;
  StreamIn *pSVar2;
  
  pSVar2 = prvTidyinitStreamIn(doc,encoding);
  iVar1 = prvTidyinitFileSource(doc->allocator,&pSVar2->source,fp);
  if (iVar1 == 0) {
    pSVar2->iotype = FileIO;
  }
  else {
    (*pSVar2->allocator->vtbl->free)(pSVar2->allocator,pSVar2->charbuf);
    (*pSVar2->allocator->vtbl->free)(pSVar2->allocator,pSVar2);
    pSVar2 = (StreamIn *)0x0;
  }
  return pSVar2;
}

Assistant:

StreamIn* TY_(FileInput)( TidyDocImpl* doc, FILE *fp, int encoding )
{
    StreamIn *in = TY_(initStreamIn)( doc, encoding );
    if ( TY_(initFileSource)( doc->allocator, &in->source, fp ) != 0 )
    {
        TY_(freeStreamIn)( in );
        return NULL;
    }
    in->iotype = FileIO;
    return in;
}